

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

uint __thiscall
Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial
          (FBXConverter *this,MeshGeometry *mesh,Model *model,value_type_conflict3 index,
          aiMatrix4x4 *node_global_transform,aiNode *nd)

{
  pointer paVar1;
  pointer paVar2;
  _Rb_tree_header *p_Var3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int *piVar9;
  pointer paVar10;
  pointer paVar11;
  pointer paVar12;
  aiVector3D *paVar13;
  ShapeGeometry *this_00;
  _Base_ptr p_Var14;
  pointer ppaVar15;
  pointer ppaVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  aiFace *paVar21;
  aiAnimMesh *paVar22;
  aiAnimMesh **ppaVar23;
  size_type sVar24;
  Model *model_00;
  aiMesh *out;
  MatIndexArray *pMVar25;
  Skin *pSVar26;
  int *piVar27;
  vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_> *pvVar28
  ;
  aiVector3D *paVar29;
  ulong *puVar30;
  long lVar31;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar32;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar33;
  ulong uVar34;
  void *__s;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pvVar35;
  aiColor4D *paVar36;
  uint *puVar37;
  mapped_type *pmVar38;
  aiFace *paVar39;
  aiFace *paVar40;
  pointer piVar41;
  aiAnimMesh **ppaVar42;
  pointer paVar43;
  _Base_ptr p_Var44;
  pointer puVar45;
  _Rb_tree_header *p_Var46;
  uint uVar47;
  ulong uVar48;
  ulong uVar49;
  iterator iVar50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar51;
  MeshGeometry *pMVar52;
  uint uVar53;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar54;
  bool bVar55;
  float fVar56;
  uint in_cursor;
  aiAnimMesh *animMesh;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  uint outIndex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> reverseMapping;
  uint count;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempBinormals;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  translateIndexMap;
  key_type local_184;
  uint *local_180;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_178;
  ulong local_170;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_168;
  aiFace *local_160;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_158;
  undefined4 local_14c;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_148;
  MeshGeometry *local_140;
  ulong local_138;
  aiAnimMesh *local_130;
  MatIndexArray *local_128;
  MatIndexArray *local_120;
  aiAnimMesh **local_118;
  iterator iStack_110;
  aiAnimMesh **local_108;
  FBXConverter *local_100;
  aiFace *local_f8;
  aiFace *local_f0;
  aiFace *local_e8;
  aiFace *local_e0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_d8;
  _Rb_tree_color local_cc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  string local_a8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_88;
  aiMatrix4x4 *local_70;
  Model *local_68;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_60;
  
  local_180 = (uint *)CONCAT44(local_180._4_4_,index);
  local_68 = model;
  out = SetupEmptyMesh(this,&mesh->super_Geometry,nd);
  pMVar25 = MeshGeometry::GetMaterialIndices(mesh);
  local_178 = MeshGeometry::GetVertices(mesh);
  local_158 = MeshGeometry::GetFaceIndexCounts(mesh);
  uVar53 = 0;
  local_14c = 0;
  local_100 = this;
  if (this->doc->settings->readWeights == true) {
    pSVar26 = Geometry::DeformerSkin(&mesh->super_Geometry);
    local_14c = (undefined4)CONCAT71((int7)((ulong)pSVar26 >> 8),pSVar26 != (Skin *)0x0);
  }
  piVar27 = (pMVar25->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  piVar9 = (pMVar25->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar47 = 0;
  if (piVar27 != piVar9) {
    puVar45 = (local_158->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar47 = 0;
    uVar53 = 0;
    do {
      if (*piVar27 == (uint)local_180) {
        uVar47 = uVar47 + 1;
        uVar53 = uVar53 + *puVar45;
      }
      piVar27 = piVar27 + 1;
      puVar45 = puVar45 + 1;
    } while (piVar27 != piVar9);
  }
  local_120 = pMVar25;
  if (uVar47 != 0) {
    if (uVar53 == 0) {
      __assert_fail("count_vertices",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                    ,0x4ed,
                    "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, const aiMatrix4x4 &, aiNode &)"
                   );
    }
    local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var3 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar34 = (ulong)uVar53;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    if (((char)local_14c != '\0') ||
       (pvVar28 = Geometry::GetBlendShapes(&mesh->super_Geometry),
       (pvVar28->
       super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
       )._M_impl.super__Vector_impl_data._M_finish !=
       (pvVar28->
       super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
       )._M_impl.super__Vector_impl_data._M_start)) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_c8,uVar34);
    }
    out->mNumVertices = uVar53;
    paVar29 = (aiVector3D *)operator_new__(uVar34 * 0xc);
    memset(paVar29,0,((uVar34 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    out->mVertices = paVar29;
    out->mNumFaces = uVar47;
    uVar34 = (ulong)uVar47;
    puVar30 = (ulong *)operator_new__(uVar34 * 0x10 + 8);
    *puVar30 = uVar34;
    local_160 = (aiFace *)(puVar30 + 1);
    paVar39 = local_160;
    do {
      paVar39->mNumIndices = 0;
      paVar39->mIndices = (uint *)0x0;
      paVar39 = paVar39 + 1;
    } while (paVar39 != (aiFace *)(puVar30 + uVar34 * 2 + 1));
    out->mFaces = local_160;
    local_70 = node_global_transform;
    local_168 = MeshGeometry::GetNormals(mesh);
    paVar43 = (local_168->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    paVar10 = (local_168->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (paVar43 != paVar10) {
      paVar11 = (local_178->
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                super__Vector_impl_data._M_start;
      paVar12 = (local_178->
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      lVar31 = (long)paVar12 - (long)paVar11;
      if ((long)paVar43 - (long)paVar10 != lVar31) {
        __assert_fail("normals.size() == vertices.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                      ,0x501,
                      "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, const aiMatrix4x4 &, aiNode &)"
                     );
      }
      auVar17._8_8_ = 0;
      auVar17._0_8_ = (lVar31 >> 2) * -0x5555555555555555;
      uVar34 = 0xffffffffffffffff;
      if (SUB168(auVar17 * ZEXT816(0xc),8) == 0) {
        uVar34 = SUB168(auVar17 * ZEXT816(0xc),0);
      }
      paVar29 = (aiVector3D *)operator_new__(uVar34);
      lVar31 = (long)paVar12 - (long)paVar11;
      if (lVar31 != 0) {
        memset(paVar29,0,((lVar31 - 0xcU) / 0xc) * 0xc + 0xc);
      }
      out->mNormals = paVar29;
    }
    pvVar54 = local_168;
    pvVar32 = MeshGeometry::GetTangents(mesh);
    local_148 = MeshGeometry::GetBinormals(mesh);
    local_88.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_140 = mesh;
    local_d8 = pvVar32;
    if ((pvVar32->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_finish !=
        (pvVar32->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      if ((local_148->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish ==
          (local_148->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start) {
        lVar31 = (long)(pvVar54->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar54->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
        if (lVar31 == 0) {
          local_148 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0;
        }
        else {
          local_148 = &local_88;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                    (local_148,(lVar31 >> 2) * -0x5555555555555555);
          paVar43 = (pvVar32->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if ((pvVar32->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish != paVar43) {
            uVar53 = 1;
            uVar34 = 0;
            do {
              paVar10 = (local_168->
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              fVar56 = paVar10[uVar34].x;
              fVar4 = paVar10[uVar34].y;
              fVar5 = paVar43[uVar34].z;
              fVar6 = paVar10[uVar34].z;
              fVar7 = paVar43[uVar34].x;
              fVar8 = paVar43[uVar34].y;
              local_88.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar34].x = fVar4 * fVar5 - fVar8 * fVar6;
              local_88.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar34].y = fVar6 * fVar7 - fVar5 * fVar56;
              local_88.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar34].z = fVar56 * fVar8 - fVar7 * fVar4;
              uVar34 = (ulong)uVar53;
              paVar43 = (pvVar32->
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              uVar49 = ((long)(pvVar32->
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)paVar43 >> 2) *
                       -0x5555555555555555;
              uVar53 = uVar53 + 1;
            } while (uVar34 <= uVar49 && uVar49 - uVar34 != 0);
          }
        }
      }
      if (local_148 == (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
        local_148 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0;
      }
      else {
        paVar43 = (local_178->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        paVar10 = (local_178->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        lVar31 = (long)paVar10 - (long)paVar43;
        if (((long)(pvVar32->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar32->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start != lVar31) ||
           ((long)(local_148->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(local_148->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start != lVar31)) {
          __assert_fail("tangents.size() == vertices.size() && binormals->size() == vertices.size()"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                        ,0x51c,
                        "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, const aiMatrix4x4 &, aiNode &)"
                       );
        }
        auVar18._8_8_ = 0;
        auVar18._0_8_ = (lVar31 >> 2) * -0x5555555555555555;
        uVar34 = 0xffffffffffffffff;
        if (SUB168(auVar18 * ZEXT816(0xc),8) == 0) {
          uVar34 = SUB168(auVar18 * ZEXT816(0xc),0);
        }
        paVar29 = (aiVector3D *)operator_new__(uVar34);
        lVar31 = (long)paVar10 - (long)paVar43;
        if (lVar31 != 0) {
          memset(paVar29,0,((lVar31 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        out->mTangents = paVar29;
        paVar43 = (local_178->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        paVar10 = (local_178->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = ((long)paVar10 - (long)paVar43 >> 2) * -0x5555555555555555;
        uVar34 = 0xffffffffffffffff;
        if (SUB168(auVar19 * ZEXT816(0xc),8) == 0) {
          uVar34 = SUB168(auVar19 * ZEXT816(0xc),0);
        }
        paVar29 = (aiVector3D *)operator_new__(uVar34);
        lVar31 = (long)paVar10 - (long)paVar43;
        if (lVar31 != 0) {
          memset(paVar29,0,((lVar31 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        out->mBitangents = paVar29;
      }
    }
    local_170 = 0x2c;
    do {
      pvVar33 = MeshGeometry::GetTextureCoords(local_140,(int)local_170 - 0x2c);
      if ((pvVar33->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start ==
          (pvVar33->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        local_170 = (ulong)((int)local_170 - 0x2c);
        goto LAB_00177d2e;
      }
      paVar43 = (local_178->
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                super__Vector_impl_data._M_start;
      paVar10 = (local_178->
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = ((long)paVar10 - (long)paVar43 >> 2) * -0x5555555555555555;
      uVar34 = SUB168(auVar20 * ZEXT816(0xc),0);
      if (SUB168(auVar20 * ZEXT816(0xc),8) != 0) {
        uVar34 = 0xffffffffffffffff;
      }
      __s = operator_new__(uVar34);
      lVar31 = (long)paVar10 - (long)paVar43;
      if (lVar31 != 0) {
        memset(__s,0,((lVar31 - 0xcU) / 0xc) * 0xc + 0xc);
      }
      *(void **)((long)out + local_170 * 8 + -0xf0) = __s;
      *(undefined4 *)((long)out->mColors + local_170 * 4 + -0x30) = 2;
      local_170 = local_170 + 1;
    } while (local_170 != 0x34);
    local_170 = 8;
LAB_00177d2e:
    pMVar52 = local_140;
    local_138 = 0;
    do {
      pvVar35 = MeshGeometry::GetVertexColors(pMVar52,(uint)local_138);
      if ((pvVar35->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start ==
          (pvVar35->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish) goto LAB_00177dcd;
      paVar43 = (local_178->
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                super__Vector_impl_data._M_start;
      paVar10 = (local_178->
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      lVar31 = (long)paVar10 - (long)paVar43 >> 2;
      uVar34 = lVar31 * -0x5555555555555550;
      paVar36 = (aiColor4D *)
                operator_new__(-(ulong)((ulong)(lVar31 * -0x5555555555555555) >> 0x3c != 0) | uVar34
                              );
      if (paVar10 != paVar43) {
        memset(paVar36,0,uVar34);
      }
      out->mColors[local_138] = paVar36;
      local_138 = local_138 + 1;
    } while (local_138 != 8);
    local_138 = 8;
LAB_00177dcd:
    local_184 = 0;
    paVar39 = (aiFace *)
              (local_120->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_f0 = (aiFace *)
               (local_120->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    if (paVar39 != local_f0) {
      paVar40 = (aiFace *)
                (local_158->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_start;
      uVar34 = local_170 & 0xffffffff;
      uVar49 = local_138 & 0xffffffff;
      pvVar51 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      do {
        paVar21 = local_160;
        uVar53 = paVar40->mNumIndices;
        pMVar25 = (MatIndexArray *)(ulong)uVar53;
        local_e8 = paVar40;
        local_e0 = paVar39;
        if (paVar39->mNumIndices == (uint)local_180) {
          local_160->mNumIndices = uVar53;
          puVar37 = (uint *)operator_new__((long)pMVar25 * 4);
          paVar21->mIndices = puVar37;
          uVar47 = 8;
          if (uVar53 - 1 < 3) {
            uVar47 = *(uint *)(&DAT_001f26e4 + (ulong)(uVar53 - 1) * 4);
          }
          out->mPrimitiveTypes = uVar47 | out->mPrimitiveTypes;
          paVar39 = local_160 + 1;
          local_128 = pMVar25;
          if (uVar53 != 0) {
            pMVar25 = (MatIndexArray *)0x0;
            local_f8 = local_160 + 1;
            do {
              local_160->mIndices[(long)pMVar25] = (uint)pvVar51;
              local_158 = pvVar51;
              local_120 = pMVar25;
              if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)pvVar51] = local_184;
                pmVar38 = std::
                          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                        *)&local_60,&local_184);
                *pmVar38 = (mapped_type)local_158;
              }
              uVar48 = (ulong)local_184;
              paVar43 = (local_178->
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              paVar29 = out->mVertices;
              paVar29[(long)pvVar51].z = paVar43[uVar48].z;
              paVar43 = paVar43 + uVar48;
              fVar56 = paVar43->y;
              paVar29 = paVar29 + (long)pvVar51;
              paVar29->x = paVar43->x;
              paVar29->y = fVar56;
              paVar29 = out->mNormals;
              if (paVar29 != (aiVector3D *)0x0) {
                paVar43 = (local_168->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                paVar29[(long)pvVar51].z = paVar43[uVar48].z;
                paVar43 = paVar43 + uVar48;
                fVar56 = paVar43->y;
                paVar29[(long)pvVar51].x = paVar43->x;
                paVar29[(long)pvVar51].y = fVar56;
              }
              paVar29 = out->mTangents;
              if (paVar29 != (aiVector3D *)0x0) {
                paVar43 = (local_d8->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                paVar29[(long)pvVar51].z = paVar43[uVar48].z;
                paVar43 = paVar43 + uVar48;
                fVar56 = paVar43->y;
                paVar29[(long)pvVar51].x = paVar43->x;
                paVar29[(long)pvVar51].y = fVar56;
                paVar43 = (local_148->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                paVar29 = out->mBitangents;
                paVar29[(long)pvVar51].z = paVar43[uVar48].z;
                paVar43 = paVar43 + uVar48;
                fVar56 = paVar43->y;
                paVar29 = paVar29 + (long)pvVar51;
                paVar29->x = paVar43->x;
                paVar29->y = fVar56;
              }
              if ((float)local_170 != 0.0) {
                uVar48 = 0;
                do {
                  pvVar33 = MeshGeometry::GetTextureCoords(local_140,(uint)uVar48);
                  paVar1 = (pvVar33->
                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + local_184;
                  fVar56 = paVar1->y;
                  paVar13 = out->mTextureCoords[uVar48];
                  paVar29 = paVar13 + (long)pvVar51;
                  paVar29->x = paVar1->x;
                  paVar29->y = fVar56;
                  paVar13[(long)pvVar51].z = 0.0;
                  uVar48 = uVar48 + 1;
                } while (uVar34 != uVar48);
              }
              if ((float)local_138 != 0.0) {
                uVar48 = 0;
                do {
                  pvVar35 = MeshGeometry::GetVertexColors(local_140,(uint)uVar48);
                  paVar2 = (pvVar35->
                           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)
                           ._M_impl.super__Vector_impl_data._M_start + local_184;
                  fVar56 = paVar2->g;
                  fVar4 = paVar2->b;
                  fVar5 = paVar2->a;
                  paVar36 = out->mColors[uVar48] + (long)pvVar51;
                  paVar36->r = paVar2->r;
                  paVar36->g = fVar56;
                  paVar36->b = fVar4;
                  paVar36->a = fVar5;
                  uVar48 = uVar48 + 1;
                } while (uVar49 != uVar48);
              }
              pMVar25 = (MatIndexArray *)
                        ((long)&(local_120->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + 1);
              pvVar51 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        (ulong)((int)local_158 + 1);
              local_184 = local_184 + 1;
            } while (pMVar25 != local_128);
            local_160 = local_f8;
            paVar39 = local_160;
          }
        }
        else {
          local_184 = local_184 + uVar53;
          paVar39 = local_160;
        }
        local_160 = paVar39;
        paVar39 = (aiFace *)&local_e0->field_0x4;
        paVar40 = (aiFace *)&local_e8->field_0x4;
      } while (paVar39 != local_f0);
    }
    model_00 = local_68;
    pMVar52 = local_140;
    iVar50._M_current = (aiAnimMesh **)out;
    ConvertMaterialForMesh(local_100,out,local_68,local_140,(uint)local_180);
    if ((char)local_14c != '\0') {
      iVar50._M_current = (aiAnimMesh **)out;
      ConvertWeights(local_100,out,model_00,pMVar52,local_70,(uint)local_180,&local_c8);
    }
    local_118 = (aiAnimMesh **)0x0;
    iStack_110._M_current = (aiAnimMesh **)0x0;
    local_108 = (aiAnimMesh **)0x0;
    pvVar28 = Geometry::GetBlendShapes(&pMVar52->super_Geometry);
    paVar39 = (aiFace *)
              (pvVar28->
              super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_f8 = (aiFace *)
               (pvVar28->
               super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if (paVar39 != local_f8) {
      do {
        paVar40 = *(aiFace **)(*(long *)paVar39 + 0x48);
        local_e8 = *(aiFace **)(*(long *)paVar39 + 0x50);
        local_f0 = paVar39;
        if (paVar40 != local_e8) {
          do {
            local_180 = *(uint **)paVar40;
            local_e0 = paVar40;
            if (*(long *)(local_180 + 0x1c) != *(long *)(local_180 + 0x1a)) {
              pvVar54 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0;
              do {
                local_130 = aiCreateAnimMesh(out);
                if ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                    (*(long *)(local_180 + 0x1c) - *(long *)(local_180 + 0x1a) >> 3) <= pvVar54) {
LAB_00178694:
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,pvVar54);
                  goto LAB_001786a5;
                }
                this_00 = *(ShapeGeometry **)(*(long *)(local_180 + 0x1a) + (long)pvVar54 * 8);
                local_148 = ShapeGeometry::GetVertices(this_00);
                local_d8 = ShapeGeometry::GetNormals(this_00);
                local_128 = (MatIndexArray *)ShapeGeometry::GetIndices(this_00);
                paVar22 = local_130;
                local_168 = pvVar54;
                FixAnimMeshName(&local_a8,(FBXConverter *)iVar50._M_current,
                                &(this_00->super_Geometry).super_Object.name);
                sVar24 = local_a8._M_string_length;
                if (local_a8._M_string_length < 0x400) {
                  (paVar22->mName).length = (ai_uint32)local_a8._M_string_length;
                  memcpy((paVar22->mName).data,
                         (void *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                          (uint)local_a8._M_dataplus._M_p),local_a8._M_string_length
                        );
                  (paVar22->mName).data[sVar24] = '\0';
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(uint)local_a8._M_dataplus._M_p) !=
                    &local_a8.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                           (uint)local_a8._M_dataplus._M_p));
                }
                piVar41 = (local_128->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                if ((local_128->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish != piVar41) {
                  uVar34 = 0;
                  do {
                    pvVar54 = local_168;
                    paVar43 = (local_148->
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    uVar49 = ((long)(local_148->
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)paVar43 >> 2
                             ) * -0x5555555555555555;
                    if (uVar49 < uVar34 || uVar49 - uVar34 == 0) {
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar34);
LAB_00178683:
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar34);
                      goto LAB_00178694;
                    }
                    paVar10 = (local_d8->
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    uVar49 = ((long)(local_d8->
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)paVar10 >> 2
                             ) * -0x5555555555555555;
                    if (uVar49 < uVar34 || uVar49 - uVar34 == 0) goto LAB_00178683;
                    local_158 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                CONCAT44(local_158._4_4_,paVar43[uVar34].x);
                    local_120 = (MatIndexArray *)CONCAT44(local_120._4_4_,paVar43[uVar34].y);
                    local_170 = CONCAT44(local_170._4_4_,paVar43[uVar34].z);
                    local_178 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                                CONCAT44(local_178._4_4_,paVar10[uVar34].x);
                    local_138 = CONCAT44(local_138._4_4_,paVar10[uVar34].y);
                    local_160 = (aiFace *)CONCAT44(local_160._4_4_,paVar10[uVar34].z);
                    local_a8._M_dataplus._M_p._0_4_ = 0;
                    puVar37 = MeshGeometry::ToOutputVertexIndex
                                        (pMVar52,piVar41[uVar34],(uint *)&local_a8);
                    if ((uint)local_a8._M_dataplus._M_p != 0) {
                      uVar49 = 0;
                      do {
                        local_cc = puVar37[uVar49];
                        p_Var44 = &p_Var3->_M_header;
                        for (p_Var14 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
                            (_Rb_tree_header *)p_Var14 != (_Rb_tree_header *)0x0;
                            p_Var14 = (&p_Var14->_M_left)[bVar55]) {
                          bVar55 = (_Rb_tree_color)*(size_t *)(p_Var14 + 1) < local_cc;
                          if (!bVar55) {
                            p_Var44 = p_Var14;
                          }
                        }
                        p_Var46 = p_Var3;
                        if (((_Rb_tree_header *)p_Var44 != p_Var3) &&
                           (p_Var46 = (_Rb_tree_header *)p_Var44,
                           local_cc < (_Rb_tree_color)((_Rb_tree_header *)p_Var44)->_M_node_count))
                        {
                          p_Var46 = p_Var3;
                        }
                        if (p_Var46 != p_Var3) {
                          pmVar38 = std::
                                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  *)&local_60,&local_cc);
                          uVar53 = *pmVar38;
                          paVar29 = local_130->mVertices;
                          paVar29[uVar53].x = paVar29[uVar53].x + local_158._0_4_;
                          paVar29[uVar53].y = paVar29[uVar53].y + local_120._0_4_;
                          paVar29[uVar53].z = paVar29[uVar53].z + (float)local_170;
                          paVar29 = local_130->mNormals;
                          if (paVar29 != (aiVector3D *)0x0) {
                            paVar29[uVar53].x = paVar29[uVar53].x + local_178._0_4_;
                            paVar29[uVar53].y = paVar29[uVar53].y + (float)local_138;
                            paVar29[uVar53].z = paVar29[uVar53].z + local_160._0_4_;
                            paVar29 = local_130->mNormals;
                            fVar56 = paVar29[uVar53].z * paVar29[uVar53].z +
                                     paVar29[uVar53].x * paVar29[uVar53].x +
                                     paVar29[uVar53].y * paVar29[uVar53].y;
                            if (fVar56 < 0.0) {
                              fVar56 = sqrtf(fVar56);
                            }
                            else {
                              fVar56 = SQRT(fVar56);
                            }
                            if (0.0 < fVar56) {
                              paVar29 = paVar29 + uVar53;
                              fVar56 = 1.0 / fVar56;
                              paVar29->x = paVar29->x * fVar56;
                              paVar29->y = paVar29->y * fVar56;
                              paVar29->z = fVar56 * paVar29->z;
                            }
                          }
                        }
                        uVar49 = uVar49 + 1;
                      } while (uVar49 < (uint)local_a8._M_dataplus._M_p);
                    }
                    uVar34 = uVar34 + 1;
                    piVar41 = (local_128->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start;
                    pMVar52 = local_140;
                  } while (uVar34 < (ulong)((long)(local_128->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                            (long)piVar41 >> 2));
                }
                pvVar54 = local_168;
                fVar56 = 1.0;
                if (8 < (ulong)(*(long *)(local_180 + 0x1c) - *(long *)(local_180 + 0x1a))) {
                  fVar56 = (float)local_180[0x12] / 100.0;
                }
                local_130->mWeight = fVar56;
                iVar50._M_current = iStack_110._M_current;
                if (iStack_110._M_current == local_108) {
                  std::vector<aiAnimMesh*,std::allocator<aiAnimMesh*>>::
                  _M_realloc_insert<aiAnimMesh*const&>
                            ((vector<aiAnimMesh*,std::allocator<aiAnimMesh*>> *)&local_118,
                             iStack_110,&local_130);
                }
                else {
                  *iStack_110._M_current = local_130;
                  iStack_110._M_current = iStack_110._M_current + 1;
                }
                pvVar54 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          ((long)&(pvVar54->
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
              } while (pvVar54 < (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                                 (*(long *)(local_180 + 0x1c) - *(long *)(local_180 + 0x1a) >> 3));
            }
            paVar40 = (aiFace *)&local_e0->mIndices;
          } while (paVar40 != local_e8);
        }
        paVar39 = (aiFace *)&local_f0->mIndices;
      } while (paVar39 != local_f8);
    }
    iVar50._M_current = iStack_110._M_current;
    ppaVar23 = local_118;
    if ((long)iStack_110._M_current - (long)local_118 != 0) {
      uVar34 = (long)iStack_110._M_current - (long)local_118 >> 3;
      out->mNumAnimMeshes = (uint)uVar34;
      ppaVar42 = (aiAnimMesh **)
                 operator_new__(-(ulong)(uVar34 >> 0x3d != 0) |
                                (long)iStack_110._M_current - (long)local_118);
      out->mAnimMeshes = ppaVar42;
      if (iVar50._M_current != ppaVar23) {
        uVar49 = 0;
        do {
          if ((ulong)((long)iStack_110._M_current - (long)local_118 >> 3) <= uVar49)
          goto LAB_001786a5;
          out->mAnimMeshes[uVar49] = local_118[uVar49];
          uVar49 = uVar49 + 1;
        } while (uVar34 + (uVar34 == 0) != uVar49);
      }
    }
    ppaVar15 = (local_100->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppaVar16 = (local_100->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (local_118 != (aiAnimMesh **)0x0) {
      operator_delete(local_118);
    }
    if (local_88.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::~_Rb_tree(&local_60);
    if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return (int)((ulong)((long)ppaVar16 - (long)ppaVar15) >> 3) - 1;
  }
LAB_001786b3:
  __assert_fail("count_faces",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                ,0x4ec,
                "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, const aiMatrix4x4 &, aiNode &)"
               );
LAB_001786a5:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  goto LAB_001786b3;
}

Assistant:

unsigned int FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry& mesh, const Model& model,
            MatIndexArray::value_type index,
            const aiMatrix4x4& node_global_transform,
            aiNode& nd)
        {
            aiMesh* const out_mesh = SetupEmptyMesh(mesh, nd);

            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            const std::vector<aiVector3D>& vertices = mesh.GetVertices();
            const std::vector<unsigned int>& faces = mesh.GetFaceIndexCounts();

            const bool process_weights = doc.Settings().readWeights && mesh.DeformerSkin() != NULL;

            unsigned int count_faces = 0;
            unsigned int count_vertices = 0;

            // count faces
            std::vector<unsigned int>::const_iterator itf = faces.begin();
            for (MatIndexArray::const_iterator it = mindices.begin(),
                end = mindices.end(); it != end; ++it, ++itf)
            {
                if ((*it) != index) {
                    continue;
                }
                ++count_faces;
                count_vertices += *itf;
            }

            ai_assert(count_faces);
            ai_assert(count_vertices);

            // mapping from output indices to DOM indexing, needed to resolve weights or blendshapes
            std::vector<unsigned int> reverseMapping;
            std::map<unsigned int, unsigned int> translateIndexMap;
            if (process_weights || mesh.GetBlendShapes().size() > 0) {
                reverseMapping.resize(count_vertices);
            }

            // allocate output data arrays, but don't fill them yet
            out_mesh->mNumVertices = count_vertices;
            out_mesh->mVertices = new aiVector3D[count_vertices];

            out_mesh->mNumFaces = count_faces;
            aiFace* fac = out_mesh->mFaces = new aiFace[count_faces]();


            // allocate normals
            const std::vector<aiVector3D>& normals = mesh.GetNormals();
            if (normals.size()) {
                ai_assert(normals.size() == vertices.size());
                out_mesh->mNormals = new aiVector3D[vertices.size()];
            }

            // allocate tangents, binormals.
            const std::vector<aiVector3D>& tangents = mesh.GetTangents();
            const std::vector<aiVector3D>* binormals = &mesh.GetBinormals();
            std::vector<aiVector3D> tempBinormals;

            if (tangents.size()) {
                if (!binormals->size()) {
                    if (normals.size()) {
                        // XXX this computes the binormals for the entire mesh, not only
                        // the part for which we need them.
                        tempBinormals.resize(normals.size());
                        for (unsigned int i = 0; i < tangents.size(); ++i) {
                            tempBinormals[i] = normals[i] ^ tangents[i];
                        }

                        binormals = &tempBinormals;
                    }
                    else {
                        binormals = NULL;
                    }
                }

                if (binormals) {
                    ai_assert(tangents.size() == vertices.size() && binormals->size() == vertices.size());

                    out_mesh->mTangents = new aiVector3D[vertices.size()];
                    out_mesh->mBitangents = new aiVector3D[vertices.size()];
                }
            }

            // allocate texture coords
            unsigned int num_uvs = 0;
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i, ++num_uvs) {
                const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(i);
                if (uvs.empty()) {
                    break;
                }

                out_mesh->mTextureCoords[i] = new aiVector3D[vertices.size()];
                out_mesh->mNumUVComponents[i] = 2;
            }

            // allocate vertex colors
            unsigned int num_vcs = 0;
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i, ++num_vcs) {
                const std::vector<aiColor4D>& colors = mesh.GetVertexColors(i);
                if (colors.empty()) {
                    break;
                }

                out_mesh->mColors[i] = new aiColor4D[vertices.size()];
            }

            unsigned int cursor = 0, in_cursor = 0;

            itf = faces.begin();
            for (MatIndexArray::const_iterator it = mindices.begin(), end = mindices.end(); it != end; ++it, ++itf)
            {
                const unsigned int pcount = *itf;
                if ((*it) != index) {
                    in_cursor += pcount;
                    continue;
                }

                aiFace& f = *fac++;

                f.mNumIndices = pcount;
                f.mIndices = new unsigned int[pcount];
                switch (pcount)
                {
                case 1:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                    break;
                }
                for (unsigned int i = 0; i < pcount; ++i, ++cursor, ++in_cursor) {
                    f.mIndices[i] = cursor;

                    if (reverseMapping.size()) {
                        reverseMapping[cursor] = in_cursor;
                        translateIndexMap[in_cursor] = cursor;
                    }

                    out_mesh->mVertices[cursor] = vertices[in_cursor];

                    if (out_mesh->mNormals) {
                        out_mesh->mNormals[cursor] = normals[in_cursor];
                    }

                    if (out_mesh->mTangents) {
                        out_mesh->mTangents[cursor] = tangents[in_cursor];
                        out_mesh->mBitangents[cursor] = (*binormals)[in_cursor];
                    }

                    for (unsigned int j = 0; j < num_uvs; ++j) {
                        const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(j);
                        out_mesh->mTextureCoords[j][cursor] = aiVector3D(uvs[in_cursor].x, uvs[in_cursor].y, 0.0f);
                    }

                    for (unsigned int j = 0; j < num_vcs; ++j) {
                        const std::vector<aiColor4D>& cols = mesh.GetVertexColors(j);
                        out_mesh->mColors[j][cursor] = cols[in_cursor];
                    }
                }
            }

            ConvertMaterialForMesh(out_mesh, model, mesh, index);

            if (process_weights) {
                ConvertWeights(out_mesh, model, mesh, node_global_transform, index, &reverseMapping);
            }

            std::vector<aiAnimMesh*> animMeshes;
            for (const BlendShape* blendShape : mesh.GetBlendShapes()) {
                for (const BlendShapeChannel* blendShapeChannel : blendShape->BlendShapeChannels()) {
                    const std::vector<const ShapeGeometry*>& shapeGeometries = blendShapeChannel->GetShapeGeometries();
                    for (size_t i = 0; i < shapeGeometries.size(); i++) {
                        aiAnimMesh* animMesh = aiCreateAnimMesh(out_mesh);
                        const ShapeGeometry* shapeGeometry = shapeGeometries.at(i);
                        const std::vector<aiVector3D>& vertices = shapeGeometry->GetVertices();
                        const std::vector<aiVector3D>& normals = shapeGeometry->GetNormals();
                        const std::vector<unsigned int>& indices = shapeGeometry->GetIndices();
                        animMesh->mName.Set(FixAnimMeshName(shapeGeometry->Name()));
                        for (size_t j = 0; j < indices.size(); j++) {
                            unsigned int index = indices.at(j);
                            aiVector3D vertex = vertices.at(j);
                            aiVector3D normal = normals.at(j);
                            unsigned int count = 0;
                            const unsigned int* outIndices = mesh.ToOutputVertexIndex(index, count);
                            for (unsigned int k = 0; k < count; k++) {
                                unsigned int outIndex = outIndices[k];
                                if (translateIndexMap.find(outIndex) == translateIndexMap.end())
                                    continue;
                                unsigned int index = translateIndexMap[outIndex];
                                animMesh->mVertices[index] += vertex;
                                if (animMesh->mNormals != nullptr) {
                                    animMesh->mNormals[index] += normal;
                                    animMesh->mNormals[index].NormalizeSafe();
                                }
                            }
                        }
                        animMesh->mWeight = shapeGeometries.size() > 1 ? blendShapeChannel->DeformPercent() / 100.0f : 1.0f;
                        animMeshes.push_back(animMesh);
                    }
                }
            }

            const size_t numAnimMeshes = animMeshes.size();
            if (numAnimMeshes > 0) {
                out_mesh->mNumAnimMeshes = static_cast<unsigned int>(numAnimMeshes);
                out_mesh->mAnimMeshes = new aiAnimMesh*[numAnimMeshes];
                for (size_t i = 0; i < numAnimMeshes; i++) {
                    out_mesh->mAnimMeshes[i] = animMeshes.at(i);
                }
            }

            return static_cast<unsigned int>(meshes.size() - 1);
        }